

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O3

void __thiscall QGraphicsAnchorLayoutPrivate::createLayoutEdges(QGraphicsAnchorLayoutPrivate *this)

{
  QGraphicsLayoutItem *firstItem;
  Data *pDVar1;
  AnchorData *pAVar2;
  Node<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
  *pNVar3;
  AnchorVertex *pAVar4;
  long in_FS_OFFSET;
  pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  firstItem = (this->super_QGraphicsLayoutPrivate).super_QGraphicsLayoutItemPrivate.q_ptr;
  pAVar2 = (AnchorData *)operator_new(0x80);
  (pAVar2->super_QSimplexVariable).result = 0.0;
  pAVar4 = (AnchorVertex *)0x0;
  (pAVar2->super_QSimplexVariable).index = 0;
  pAVar2->_vptr_AnchorData = (_func_int **)&PTR__AnchorData_00811180;
  pAVar2->from = (AnchorVertex *)0x0;
  pAVar2->to = (AnchorVertex *)0x0;
  pAVar2->minSize = 0.0;
  pAVar2->prefSize = 0.0;
  pAVar2->maxSize = 0.0;
  pAVar2->minPrefSize = 0.0;
  pAVar2->maxPrefSize = 0.0;
  pAVar2->sizeAtMinimum = 0.0;
  pAVar2->sizeAtPreferred = 0.0;
  pAVar2->sizeAtMaximum = 0.0;
  pAVar2->item = (QGraphicsLayoutItem *)0x0;
  pAVar2->graphicsAnchor = (QGraphicsAnchor *)0x0;
  pAVar2->field_0x78 = 0;
  addAnchor_helper(this,firstItem,AnchorLeft,firstItem,AnchorRight,pAVar2);
  pAVar2->maxSize = 16777215.0;
  local_48.second = AnchorLeft;
  pDVar1 = (this->m_vertexList).d;
  if (pDVar1 != (Data *)0x0) {
    local_48.first = firstItem;
    pNVar3 = QHashPrivate::
             Data<QHashPrivate::Node<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>,std::pair<QtGraphicsAnchorLayout::AnchorVertex*,int>>>
             ::findNode<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>>
                       ((Data<QHashPrivate::Node<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>,std::pair<QtGraphicsAnchorLayout::AnchorVertex*,int>>>
                         *)pDVar1,&local_48);
    if (pNVar3 == (Node<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
                   *)0x0) {
      pAVar4 = (AnchorVertex *)0x0;
    }
    else {
      pAVar4 = (pNVar3->value).first;
    }
  }
  (this->layoutFirstVertex).m_data[0] = pAVar4;
  (this->layoutCentralVertex).m_data[0] = (AnchorVertex *)0x0;
  local_48.second = AnchorRight;
  pDVar1 = (this->m_vertexList).d;
  local_48.first = firstItem;
  if (pDVar1 == (Data *)0x0) {
LAB_005bf202:
    pAVar4 = (AnchorVertex *)0x0;
  }
  else {
    pNVar3 = QHashPrivate::
             Data<QHashPrivate::Node<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>,std::pair<QtGraphicsAnchorLayout::AnchorVertex*,int>>>
             ::findNode<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>>
                       ((Data<QHashPrivate::Node<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>,std::pair<QtGraphicsAnchorLayout::AnchorVertex*,int>>>
                         *)pDVar1,&local_48);
    if (pNVar3 == (Node<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
                   *)0x0) goto LAB_005bf202;
    pAVar4 = (pNVar3->value).first;
  }
  (this->layoutLastVertex).m_data[0] = pAVar4;
  pAVar2 = (AnchorData *)operator_new(0x80);
  (pAVar2->super_QSimplexVariable).result = 0.0;
  (pAVar2->super_QSimplexVariable).index = 0;
  pAVar2->_vptr_AnchorData = (_func_int **)&PTR__AnchorData_00811180;
  pAVar2->from = (AnchorVertex *)0x0;
  pAVar2->to = (AnchorVertex *)0x0;
  pAVar2->minSize = 0.0;
  pAVar2->prefSize = 0.0;
  pAVar2->maxSize = 0.0;
  pAVar2->minPrefSize = 0.0;
  pAVar2->maxPrefSize = 0.0;
  pAVar2->sizeAtMinimum = 0.0;
  pAVar2->sizeAtPreferred = 0.0;
  pAVar2->sizeAtMaximum = 0.0;
  pAVar2->item = (QGraphicsLayoutItem *)0x0;
  pAVar2->graphicsAnchor = (QGraphicsAnchor *)0x0;
  pAVar2->field_0x78 = 0;
  addAnchor_helper(this,firstItem,AnchorTop,firstItem,AnchorBottom,pAVar2);
  pAVar2->maxSize = 16777215.0;
  local_48.second = AnchorTop;
  pDVar1 = (this->m_vertexList).d;
  if (pDVar1 == (Data *)0x0) {
LAB_005bf294:
    pAVar4 = (AnchorVertex *)0x0;
  }
  else {
    local_48.first = firstItem;
    pNVar3 = QHashPrivate::
             Data<QHashPrivate::Node<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>,std::pair<QtGraphicsAnchorLayout::AnchorVertex*,int>>>
             ::findNode<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>>
                       ((Data<QHashPrivate::Node<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>,std::pair<QtGraphicsAnchorLayout::AnchorVertex*,int>>>
                         *)pDVar1,&local_48);
    if (pNVar3 == (Node<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
                   *)0x0) goto LAB_005bf294;
    pAVar4 = (pNVar3->value).first;
  }
  (this->layoutFirstVertex).m_data[1] = pAVar4;
  (this->layoutCentralVertex).m_data[1] = (AnchorVertex *)0x0;
  local_48.second = AnchorBottom;
  pDVar1 = (this->m_vertexList).d;
  local_48.first = firstItem;
  if (pDVar1 != (Data *)0x0) {
    pNVar3 = QHashPrivate::
             Data<QHashPrivate::Node<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>,std::pair<QtGraphicsAnchorLayout::AnchorVertex*,int>>>
             ::findNode<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>>
                       ((Data<QHashPrivate::Node<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>,std::pair<QtGraphicsAnchorLayout::AnchorVertex*,int>>>
                         *)pDVar1,&local_48);
    if (pNVar3 != (Node<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
                   *)0x0) {
      pAVar4 = (pNVar3->value).first;
      goto LAB_005bf2d5;
    }
  }
  pAVar4 = (AnchorVertex *)0x0;
LAB_005bf2d5:
  (this->layoutLastVertex).m_data[1] = pAVar4;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsAnchorLayoutPrivate::createLayoutEdges()
{
    Q_Q(QGraphicsAnchorLayout);
    QGraphicsLayoutItem *layout = q;

    // Horizontal
    AnchorData *data = new AnchorData;
    addAnchor_helper(layout, Qt::AnchorLeft, layout,
                     Qt::AnchorRight, data);
    data->maxSize = QWIDGETSIZE_MAX;

    // Save a reference to layout vertices
    layoutFirstVertex[Qt::Horizontal] = internalVertex(layout, Qt::AnchorLeft);
    layoutCentralVertex[Qt::Horizontal] = nullptr;
    layoutLastVertex[Qt::Horizontal] = internalVertex(layout, Qt::AnchorRight);

    // Vertical
    data = new AnchorData;
    addAnchor_helper(layout, Qt::AnchorTop, layout,
                     Qt::AnchorBottom, data);
    data->maxSize = QWIDGETSIZE_MAX;

    // Save a reference to layout vertices
    layoutFirstVertex[Qt::Vertical] = internalVertex(layout, Qt::AnchorTop);
    layoutCentralVertex[Qt::Vertical] = nullptr;
    layoutLastVertex[Qt::Vertical] = internalVertex(layout, Qt::AnchorBottom);
}